

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall
QWidgetWindow::handleDragEnterEvent(QWidgetWindow *this,QDragMoveEvent *event,QWidget *widget)

{
  long lVar1;
  Data *pDVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 *puVar5;
  QDragEnterEvent *pQVar6;
  QObject *pQVar7;
  QWidget *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QDragEnterEvent translated;
  undefined1 uStack_8c;
  QPoint local_48;
  QPoint local_40;
  QPoint mapped;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    pDVar2 = (this->m_widget).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    else {
      pQVar8 = (QWidget *)(this->m_widget).wp.value;
    }
    _translated = *(qreal *)(event + 0x10);
    mapped = QPointF::toPoint((QPointF *)&translated);
    widget = findDnDTarget(pQVar8,&mapped);
    if (widget == (QWidget *)0x0) {
      event[0xc] = (QDragMoveEvent)0x0;
      goto LAB_00314cf7;
    }
  }
  QWeakPointer<QObject>::assign<QObject>(&(this->m_dragTarget).wp,&widget->super_QObject);
  mapped = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = (this->m_widget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = (QWidget *)(this->m_widget).wp.value;
  }
  _translated = *(qreal *)(event + 0x10);
  uVar3 = *(undefined8 *)(event + 0x18);
  local_48 = QPointF::toPoint((QPointF *)&translated);
  local_40 = QWidget::mapToGlobal(pQVar8,&local_48);
  mapped = QWidget::mapFromGlobal(widget,&local_40);
  puVar5 = &DAT_005eb6b0;
  pQVar6 = &translated;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)pQVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
    pQVar6 = (QDragEnterEvent *)((long)pQVar6 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  QDragEnterEvent::QDragEnterEvent
            (&translated,&mapped,*(undefined4 *)(event + 0x28),*(undefined8 *)(event + 0x38),
             *(undefined4 *)(event + 0x20),*(undefined4 *)(event + 0x24));
  pDVar2 = (this->m_dragTarget).wp.d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar7 = (QObject *)0x0;
  }
  else {
    pQVar7 = (this->m_dragTarget).wp.value;
  }
  QCoreApplication::forwardEvent(pQVar7,(QEvent *)&translated,(QEvent *)event);
  uStack_8c = (undefined1)((ulong)uVar3 >> 0x20);
  (**(code **)(*(long *)event + 0x10))(event,uStack_8c);
  QDropEvent::setDropAction((DropAction)event);
  QDragEnterEvent::~QDragEnterEvent(&translated);
LAB_00314cf7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleDragEnterEvent(QDragMoveEvent *event, QWidget *widget)
{
    Q_ASSERT(m_dragTarget == nullptr);
    if (!widget)
        widget = findDnDTarget(m_widget, event->position().toPoint());
    if (!widget) {
        event->ignore();
        return;
    }
    m_dragTarget = widget;

    const QPoint mapped = widget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDragEnterEvent translated(mapped, event->possibleActions(), event->mimeData(),
                               event->buttons(), event->modifiers());
    QGuiApplication::forwardEvent(m_dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}